

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.cpp
# Opt level: O3

void __thiscall
fp::Algorithm::FindNeighbours(Algorithm *this,array<int,_2UL> cur_node,char curr_dir)

{
  iterator *piVar1;
  bool bVar2;
  bool bVar3;
  _Elt_pointer paVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  long lVar9;
  array<int,_2UL> cur_node_00;
  array<int,_2UL> cur_node_01;
  array<int,_2UL> cur_node_02;
  array<int,_2UL> cur_node_03;
  int iVar10;
  array<int,_2UL> node_E;
  array<int,_2UL> node_S;
  array<int,_2UL> node_W;
  array<int,_2UL> node_N;
  array<int,_2UL> local_50;
  array<int,_2UL> local_48;
  array<int,_2UL> local_40;
  array<int,_2UL> local_38;
  
  (**((this->robot_).super___shared_ptr<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     _vptr_LandBasedRobot)();
  iVar10 = cur_node._M_elems[0];
  lVar9 = (long)cur_node._M_elems >> 0x20;
  bVar7 = (this->maze_info).North_._M_elems[iVar10]._M_elems[lVar9];
  bVar2 = (this->maze_info).South_._M_elems[iVar10]._M_elems[lVar9];
  bVar6 = (this->maze_info).East_._M_elems[iVar10]._M_elems[lVar9];
  bVar3 = (this->maze_info).West_._M_elems[iVar10]._M_elems[lVar9];
  local_38._M_elems[0] = iVar10 + -1;
  iVar8 = cur_node._M_elems[1];
  local_40._M_elems[1] = iVar8 + -1;
  local_48._M_elems[0] = iVar10 + 1;
  local_50._M_elems[1] = iVar8 + 1;
  local_50._M_elems[0] = iVar10;
  local_48._M_elems[1] = iVar8;
  local_40._M_elems[0] = iVar10;
  local_38._M_elems[1] = iVar8;
  bVar5 = IsVisited(this,cur_node);
  if (!bVar5) {
    (this->visited_node_)._M_elems[iVar10]._M_elems[lVar9] = true;
    this->visited_Count = this->visited_Count + 1;
    if ((((this->temp_goal_ == false) && (iVar8 < 0xf)) && (curr_dir != 'W')) && (bVar6 == false)) {
      paVar4 = (this->node_master_)._M_elems[iVar10]._M_elems[lVar9].child_node_.c.
               super__Deque_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (paVar4 == (this->node_master_)._M_elems[iVar10]._M_elems[lVar9].child_node_.c.
                    super__Deque_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>.
                    _M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::deque<std::array<int,2ul>,std::allocator<std::array<int,2ul>>>::
        _M_push_back_aux<std::array<int,2ul>const&>
                  ((deque<std::array<int,2ul>,std::allocator<std::array<int,2ul>>> *)
                   &(this->node_master_)._M_elems[iVar10]._M_elems[lVar9].child_node_,&local_50);
        cur_node_00._M_elems[1] = local_50._M_elems[1];
        cur_node_00._M_elems[0] = local_50._M_elems[0];
      }
      else {
        cur_node_00._M_elems[1] = local_50._M_elems[1];
        cur_node_00._M_elems[0] = local_50._M_elems[0];
        *&paVar4->_M_elems = cur_node_00._M_elems;
        piVar1 = &(this->node_master_)._M_elems[iVar10]._M_elems[lVar9].child_node_.c.
                  super__Deque_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>.
                  _M_impl.super__Deque_impl_data._M_finish;
        piVar1->_M_cur = piVar1->_M_cur + 1;
      }
      bVar6 = IsVisited(this,cur_node_00);
      if (!bVar6) {
        *&(this->node_master_)._M_elems[local_50._M_elems[0]]._M_elems[local_50._M_elems[1]].
          parent_node_._M_elems = cur_node._M_elems;
      }
    }
    if (((this->temp_goal_ == false) && (0 < iVar10)) && ((curr_dir != 'S' && (bVar7 == false)))) {
      paVar4 = (this->node_master_)._M_elems[iVar10]._M_elems[lVar9].child_node_.c.
               super__Deque_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (paVar4 == (this->node_master_)._M_elems[iVar10]._M_elems[lVar9].child_node_.c.
                    super__Deque_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>.
                    _M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::deque<std::array<int,2ul>,std::allocator<std::array<int,2ul>>>::
        _M_push_back_aux<std::array<int,2ul>const&>
                  ((deque<std::array<int,2ul>,std::allocator<std::array<int,2ul>>> *)
                   &(this->node_master_)._M_elems[iVar10]._M_elems[lVar9].child_node_,&local_38);
        cur_node_01._M_elems[1] = local_38._M_elems[1];
        cur_node_01._M_elems[0] = local_38._M_elems[0];
      }
      else {
        cur_node_01._M_elems[1] = local_38._M_elems[1];
        cur_node_01._M_elems[0] = local_38._M_elems[0];
        *&paVar4->_M_elems = cur_node_01._M_elems;
        piVar1 = &(this->node_master_)._M_elems[iVar10]._M_elems[lVar9].child_node_.c.
                  super__Deque_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>.
                  _M_impl.super__Deque_impl_data._M_finish;
        piVar1->_M_cur = piVar1->_M_cur + 1;
      }
      bVar7 = IsVisited(this,cur_node_01);
      if (!bVar7) {
        *&(this->node_master_)._M_elems[local_38._M_elems[0]]._M_elems[local_38._M_elems[1]].
          parent_node_._M_elems = cur_node._M_elems;
      }
    }
    if (((this->temp_goal_ == false) && (iVar8 != 0 && -1 < (long)cur_node._M_elems)) &&
       ((curr_dir != 'E' && (bVar3 == false)))) {
      paVar4 = (this->node_master_)._M_elems[iVar10]._M_elems[lVar9].child_node_.c.
               super__Deque_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (paVar4 == (this->node_master_)._M_elems[iVar10]._M_elems[lVar9].child_node_.c.
                    super__Deque_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>.
                    _M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::deque<std::array<int,2ul>,std::allocator<std::array<int,2ul>>>::
        _M_push_back_aux<std::array<int,2ul>const&>
                  ((deque<std::array<int,2ul>,std::allocator<std::array<int,2ul>>> *)
                   &(this->node_master_)._M_elems[iVar10]._M_elems[lVar9].child_node_,&local_40);
        cur_node_02._M_elems[1] = local_40._M_elems[1];
        cur_node_02._M_elems[0] = local_40._M_elems[0];
      }
      else {
        cur_node_02._M_elems[1] = local_40._M_elems[1];
        cur_node_02._M_elems[0] = local_40._M_elems[0];
        *&paVar4->_M_elems = cur_node_02._M_elems;
        piVar1 = &(this->node_master_)._M_elems[iVar10]._M_elems[lVar9].child_node_.c.
                  super__Deque_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>.
                  _M_impl.super__Deque_impl_data._M_finish;
        piVar1->_M_cur = piVar1->_M_cur + 1;
      }
      bVar7 = IsVisited(this,cur_node_02);
      if (!bVar7) {
        *&(this->node_master_)._M_elems[local_40._M_elems[0]]._M_elems[local_40._M_elems[1]].
          parent_node_._M_elems = cur_node._M_elems;
      }
    }
    if ((((this->temp_goal_ == false) && (iVar10 < 0xf)) && (curr_dir != 'N')) && (bVar2 == false))
    {
      paVar4 = (this->node_master_)._M_elems[iVar10]._M_elems[lVar9].child_node_.c.
               super__Deque_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (paVar4 == (this->node_master_)._M_elems[iVar10]._M_elems[lVar9].child_node_.c.
                    super__Deque_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>.
                    _M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::deque<std::array<int,2ul>,std::allocator<std::array<int,2ul>>>::
        _M_push_back_aux<std::array<int,2ul>const&>
                  ((deque<std::array<int,2ul>,std::allocator<std::array<int,2ul>>> *)
                   &(this->node_master_)._M_elems[iVar10]._M_elems[lVar9].child_node_,&local_48);
        cur_node_03._M_elems[1] = local_48._M_elems[1];
        cur_node_03._M_elems[0] = local_48._M_elems[0];
      }
      else {
        cur_node_03._M_elems[1] = local_48._M_elems[1];
        cur_node_03._M_elems[0] = local_48._M_elems[0];
        *&paVar4->_M_elems = cur_node_03._M_elems;
        piVar1 = &(this->node_master_)._M_elems[iVar10]._M_elems[lVar9].child_node_.c.
                  super__Deque_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>.
                  _M_impl.super__Deque_impl_data._M_finish;
        piVar1->_M_cur = piVar1->_M_cur + 1;
      }
      bVar7 = IsVisited(this,cur_node_03);
      if (!bVar7) {
        *&(this->node_master_)._M_elems[local_48._M_elems[0]]._M_elems[local_48._M_elems[1]].
          parent_node_._M_elems = cur_node._M_elems;
      }
    }
  }
  return;
}

Assistant:

void fp::Algorithm::FindNeighbours(std::array<int, 2> cur_node, char curr_dir) {
    char robotDirection{this->robot_->GetDirection()};
    bool N{this->maze_info.North_[cur_node[0]][cur_node[1]]},
            S{this->maze_info.South_[cur_node[0]][cur_node[1]]},
            E{this->maze_info.East_[cur_node[0]][cur_node[1]]},
            W{this->maze_info.West_[cur_node[0]][cur_node[1]]};

    //---> Compute the neighbouring possible  nodes <---//
    std::array<int, 2> node_N{cur_node[0] - 1, cur_node[1]},
            node_W{cur_node[0], cur_node[1] - 1},
            node_S{cur_node[0] + 1, cur_node[1]},
            node_E{cur_node[0], cur_node[1] + 1};

    if (!IsVisited(cur_node)) {
        this->visited_node_[cur_node[0]][cur_node[1]] = true;
        this->visited_Count++;
        if (!this->temp_goal_ && node_E[1] <= 15 && !E && curr_dir != 'W') {
            this->node_master_[cur_node[0]][cur_node[1]].child_node_.push(node_E);
            if (!IsVisited(node_E))
                this->node_master_[node_E[0]][node_E[1]].parent_node_ = cur_node;
        }
        if (!this->temp_goal_ && node_N[0] >= 0 && !N && curr_dir != 'S') {
            this->node_master_[cur_node[0]][cur_node[1]].child_node_.push(node_N);
            if (!IsVisited(node_N))
                this->node_master_[node_N[0]][node_N[1]].parent_node_ = cur_node;
        }
        if (!this->temp_goal_ && node_W[1] >= 0 && !W && curr_dir != 'E') {
            this->node_master_[cur_node[0]][cur_node[1]].child_node_.push(node_W);
            if (!IsVisited(node_W))
                this->node_master_[node_W[0]][node_W[1]].parent_node_ = cur_node;
        }
        if (!this->temp_goal_ && node_S[0] <= 15 && !S && curr_dir != 'N') {
            this->node_master_[cur_node[0]][cur_node[1]].child_node_.push(node_S);
            if (!IsVisited(node_S))
                this->node_master_[node_S[0]][node_S[1]].parent_node_ = cur_node;
        }
    }
}